

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

int ws_str_get(void *arg,char *nm,void *buf,size_t *szp,nni_type t)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *str;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x60));
  cVar1 = *(char *)((long)arg + 0x51);
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
  iVar2 = 7;
  if (cVar1 == '\0') {
    iVar2 = nni_http_conn_getopt(*(nni_http_conn **)((long)arg + 0x9e8),nm,buf,szp,t);
    if (iVar2 == 9) {
      iVar2 = nni_getopt(ws_options,nm,arg,buf,szp,t);
      if (iVar2 == 9) {
        iVar3 = strncmp(nm,"ws:header:",10);
        iVar2 = 9;
        if (iVar3 == 0) {
          str = nni_http_get_header(*(nng_http **)((long)arg + 0x9e8),nm + 10);
          if (str != (char *)0x0) {
            iVar2 = nni_copyout_str(str,buf,szp,t);
            return iVar2;
          }
          iVar2 = 0xc;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int
ws_str_get(void *arg, const char *nm, void *buf, size_t *szp, nni_type t)
{
	nni_ws *ws = arg;
	int     rv;

	nni_mtx_lock(&ws->mtx);
	if (ws->closed) {
		nni_mtx_unlock(&ws->mtx);
		return (NNG_ECLOSED);
	}
	nni_mtx_unlock(&ws->mtx);
	rv = nni_http_conn_getopt(ws->http, nm, buf, szp, t);
	if (rv == NNG_ENOTSUP) {
		rv = nni_getopt(ws_options, nm, ws, buf, szp, t);
	}
	// Check for generic headers...
	if (rv == NNG_ENOTSUP) {
		if (startswith(nm, NNG_OPT_WS_HEADER)) {
			rv = ws_get_header(ws, nm, buf, szp, t);
		}
	}
	return (rv);
}